

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O1

bool bssl::ssl_send_tls12_certificate(SSL_HANDSHAKE *hs)

{
  ssl_credential_st *psVar1;
  __uniq_ptr_data<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter,_true,_true> sk;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  CRYPTO_BUFFER *buf;
  uint8_t *data;
  size_t i;
  ulong i_00;
  ScopedCBB cbb;
  CBB certs;
  CBB body;
  CBB cert;
  CBB local_f0;
  CBB local_c0;
  CBB local_90;
  CBB local_60;
  
  CBB_zero(&local_f0);
  bVar2 = (*hs->ssl->method->init_message)(hs->ssl,&local_f0,&local_90,'\v');
  if (bVar2) {
    iVar3 = CBB_add_u24_length_prefixed(&local_90,&local_c0);
    if (iVar3 != 0) {
      psVar1 = (hs->credential)._M_t.
               super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl;
      if (psVar1 == (ssl_credential_st *)0x0) {
LAB_00144e3e:
        bVar2 = ssl_add_message_cbb(hs->ssl,&local_f0);
        goto LAB_00144e20;
      }
      if (psVar1->type != kX509) {
        __assert_fail("hs->credential->type == SSLCredentialType::kX509",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                      ,0x1d8,"bool bssl::ssl_send_tls12_certificate(SSL_HANDSHAKE *)");
      }
      sk.super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl =
           (psVar1->chain)._M_t.
           super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>;
      i_00 = 0;
      do {
        sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)
                               sk.
                               super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                               .super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl)
        ;
        if (sVar4 <= i_00) goto LAB_00144e3e;
        buf = (CRYPTO_BUFFER *)
              OPENSSL_sk_value((OPENSSL_STACK *)
                               sk.
                               super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                               .super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl,
                               i_00);
        iVar3 = CBB_add_u24_length_prefixed(&local_c0,&local_60);
        if (iVar3 == 0) break;
        data = CRYPTO_BUFFER_data(buf);
        sVar4 = CRYPTO_BUFFER_len(buf);
        iVar3 = CBB_add_bytes(&local_60,data,sVar4);
        i_00 = i_00 + 1;
      } while (iVar3 != 0);
    }
  }
  bVar2 = false;
LAB_00144e20:
  CBB_cleanup(&local_f0);
  return bVar2;
}

Assistant:

bool ssl_send_tls12_certificate(SSL_HANDSHAKE *hs) {
  ScopedCBB cbb;
  CBB body, certs, cert;
  if (!hs->ssl->method->init_message(hs->ssl, cbb.get(), &body,
                                     SSL3_MT_CERTIFICATE) ||
      !CBB_add_u24_length_prefixed(&body, &certs)) {
    return false;
  }

  if (hs->credential != nullptr) {
    assert(hs->credential->type == SSLCredentialType::kX509);
    STACK_OF(CRYPTO_BUFFER) *chain = hs->credential->chain.get();
    for (size_t i = 0; i < sk_CRYPTO_BUFFER_num(chain); i++) {
      CRYPTO_BUFFER *buffer = sk_CRYPTO_BUFFER_value(chain, i);
      if (!CBB_add_u24_length_prefixed(&certs, &cert) ||
          !CBB_add_bytes(&cert, CRYPTO_BUFFER_data(buffer),
                         CRYPTO_BUFFER_len(buffer))) {
        return false;
      }
    }
  }

  return ssl_add_message_cbb(hs->ssl, cbb.get());
}